

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node *
lyd_new_output_anydata
          (lyd_node *parent,lys_module *module,char *name,void *value,
          LYD_ANYDATA_VALUETYPE value_type)

{
  void *name_00;
  char *mod;
  int iVar1;
  LY_ERR *pLVar2;
  lys_node *siblings_00;
  size_t sVar3;
  lys_node *local_48;
  lys_node *snode;
  lys_node *siblings;
  void *pvStack_30;
  LYD_ANYDATA_VALUETYPE value_type_local;
  void *value_local;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  siblings._4_4_ = value_type;
  pvStack_30 = value;
  value_local = name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  if (((parent == (lyd_node *)0x0) && (module == (lys_module *)0x0)) || (name == (char *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    parent_local = (lyd_node *)0x0;
  }
  else {
    siblings_00 = lyd_new_find_schema(parent,module,1);
    mod = name_local;
    name_00 = value_local;
    snode = siblings_00;
    if (siblings_00 == (lys_node *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINVAL;
      parent_local = (lyd_node *)0x0;
    }
    else {
      sVar3 = strlen((char *)value_local);
      iVar1 = lys_get_data_sibling
                        ((lys_module *)mod,siblings_00,(char *)name_00,(int)sVar3,LYS_ANYDATA,
                         &local_48);
      if ((iVar1 == 0) && (local_48 != (lys_node *)0x0)) {
        parent_local = lyd_create_anydata((lyd_node *)module_local,local_48,pvStack_30,
                                          siblings._4_4_);
      }
      else {
        parent_local = (lyd_node *)0x0;
      }
    }
  }
  return parent_local;
}

Assistant:

lyd_node *
lyd_new_output_anydata(struct lyd_node *parent, const struct lys_module *module, const char *name,
                       void *value, LYD_ANYDATA_VALUETYPE value_type)
{
    const struct lys_node *siblings, *snode;

    if ((!parent && !module) || !name) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 1);
    if (!siblings) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (lys_get_data_sibling(module, siblings, name, strlen(name), LYS_ANYDATA, &snode) || !snode) {
        return NULL;
    }

    return lyd_create_anydata(parent, snode, value, value_type);
}